

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_odd_last(void)

{
  undefined4 local_5c;
  array<int,_5UL> storage;
  int local_44;
  int *local_40;
  int *local_38;
  
  storage._M_elems[0] = 0xb;
  storage._M_elems[1] = 0x16;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x2c;
  storage._M_elems[4] = 0x37;
  local_5c = 0x36;
  local_40 = vista::lower_bound_sorted<int*,int,std::less<int>>(&storage,&local_44,&local_5c);
  local_38 = storage._M_elems + 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 54)",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x414,"void lower_bound_sorted_suite::find_odd_last()",&local_40,&local_38);
  local_5c = 0x37;
  local_40 = vista::lower_bound_sorted<int*,int,std::less<int>>(&storage,&local_44,&local_5c);
  local_38 = storage._M_elems + 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 55)",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x416,"void lower_bound_sorted_suite::find_odd_last()",&local_40,&local_38);
  local_5c = 0x38;
  local_40 = vista::lower_bound_sorted<int*,int,std::less<int>>(&storage,&local_44,&local_5c);
  local_38 = &local_44;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 56)","storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x418,"void lower_bound_sorted_suite::find_odd_last()",&local_40,&local_38);
  return;
}

Assistant:

void find_odd_last()
{
    std::array<int, 5> storage = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 54),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 55),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 56),
                  storage.end());
}